

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O1

void os_gen_rand_bytes(uchar *buf,size_t len)

{
  uchar uVar1;
  size_t sVar2;
  independent_bits_engine<std::random_device,_8UL,_unsigned_char> eng;
  random_device rStack_13a8;
  
  std::random_device::random_device(&rStack_13a8);
  if (len != 0) {
    sVar2 = 0;
    do {
      uVar1 = std::random_device::_M_getval();
      buf[sVar2] = uVar1;
      sVar2 = sVar2 + 1;
    } while (len != sVar2);
  }
  std::random_device::_M_fini();
  return;
}

Assistant:

void os_gen_rand_bytes( unsigned char* buf, size_t len )
{
    std::independent_bits_engine
            <std::random_device, CHAR_BIT, unsigned char> eng;
    std::generate(buf, buf + len, std::ref(eng));
}